

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O0

unsigned_long bit_offset(dmr_C *C,expression *expr)

{
  int iVar1;
  unsigned_long local_20;
  unsigned_long offset;
  expression *expr_local;
  dmr_C *C_local;
  
  local_20 = 0;
  for (offset = (unsigned_long)expr; (*(ushort *)offset & 0xff) == 0x1b;
      offset = *(unsigned_long *)(offset + 0x28)) {
    iVar1 = dmrC_bytes_to_bits(C->target,*(int *)(offset + 0x20));
    local_20 = (long)iVar1 + local_20;
  }
  if ((offset != 0) && (*(long *)(offset + 0x10) != 0)) {
    local_20 = (*(uint *)(*(long *)(offset + 0x10) + 0x54) & 0xff) + local_20;
  }
  return local_20;
}

Assistant:

static unsigned long bit_offset(struct dmr_C *C, const struct expression *expr)
{
	unsigned long offset = 0;
	while (expr->type == EXPR_POS) {
		offset += dmrC_bytes_to_bits(C->target, expr->init_offset);
		expr = expr->init_expr;
	}
	if (expr && expr->ctype)
		offset += expr->ctype->bit_offset;
	return offset;
}